

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Edge *this_00;
  BindingEnv *pBVar2;
  BuildLog *this_01;
  Node *node;
  Metrics *this_02;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  pointer ppNVar8;
  long lVar9;
  undefined4 extraout_var_01;
  int *piVar10;
  long *plVar11;
  undefined4 extraout_var_02;
  Metric *pMVar12;
  size_type *psVar13;
  pointer ppNVar14;
  long mtime;
  string rspfile;
  string deps_type;
  int end_time;
  int start_time;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  ScopedMetric metrics_h_scoped;
  string local_158;
  string *local_138;
  string local_130;
  string local_110;
  int local_f0;
  int local_ec;
  string local_e8;
  long *local_c8 [2];
  long local_b8 [2];
  vector<Node_*,_std::allocator<Node_*>_> local_a8;
  DependencyScan *local_90;
  Plan *local_88;
  string local_80;
  string local_60;
  ScopedMetric local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_138 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar6 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar6 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar12 = (Metric *)0x0;
    }
    else {
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"FinishCommand","");
      pMVar12 = Metrics::NewMetric(this_02,&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar12;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"deps","");
  Edge::GetBinding(&local_110,this_00,&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"msvc_deps_prefix","");
  Edge::GetBinding(&local_e8,this_00,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if (local_110._M_string_length != 0) {
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)paVar1;
    bVar3 = ExtractDeps(this,result,&local_110,&local_e8,&local_a8,&local_158);
    if ((!bVar3) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_158._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != paVar1) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  BuildStatus::BuildEdgeFinished
            (this->status_,this_00,result->status == ExitSuccess,&result->output,&local_ec,&local_f0
            );
  if (result->status != ExitSuccess) {
    bVar3 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_138);
    goto LAB_0017cf02;
  }
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"restat","");
  bVar3 = Edge::GetBindingBool(this_00,&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p,
                    CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                             local_158.field_2._M_local_buf[0]) + 1);
  }
  if (this->config_->dry_run == false) {
    ppNVar14 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (ppNVar14 ==
        (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      mtime = 0;
      goto LAB_0017cb46;
    }
    local_88 = &this->plan_;
    local_90 = &this->scan_;
    bVar5 = false;
    mtime = 0;
    do {
      iVar6 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&(*ppNVar14)->env_path_,local_138);
      lVar7 = CONCAT44(extraout_var,iVar6);
      if (lVar7 == -1) goto LAB_0017cf00;
      if (mtime < lVar7) {
        mtime = lVar7;
      }
      if ((*ppNVar14)->mtime_ == lVar7 && bVar3) {
        bVar4 = Plan::CleanNode(local_88,local_90,*ppNVar14,local_138);
        bVar5 = true;
        if (!bVar4) goto LAB_0017cf00;
      }
      ppNVar14 = ppNVar14 + 1;
    } while (ppNVar14 !=
             (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if (!bVar5) goto LAB_0017cb46;
    ppNVar8 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    lVar7 = 0;
    for (ppNVar14 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar14 != ppNVar8; ppNVar14 = ppNVar14 + 1)
    {
      iVar6 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&(*ppNVar14)->env_path_,local_138);
      lVar9 = CONCAT44(extraout_var_00,iVar6);
      if (lVar9 == -1) goto LAB_0017cf00;
      if (lVar7 < lVar9) {
        lVar7 = lVar9;
      }
      ppNVar8 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
    }
    Edge::GetUnescapedDepfile_abi_cxx11_(&local_158,this_00);
    if (lVar7 == 0) {
      lVar7 = 0;
LAB_0017ceca:
      mtime = lVar7;
      this->status_->total_edges_ = (this->plan_).command_edges_;
      bVar3 = true;
    }
    else {
      if ((local_110._M_string_length != 0) || (local_158._M_string_length == 0)) goto LAB_0017ceca;
      pBVar2 = this_00->env_;
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,local_158._M_dataplus._M_p,
                 local_158._M_dataplus._M_p + local_158._M_string_length);
      RelPathEnv::ApplyChdir(&local_130,&pBVar2->super_RelPathEnv,&local_60);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_130);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      iVar6 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                        (this->disk_interface_,&local_158,local_138);
      lVar9 = CONCAT44(extraout_var_02,iVar6);
      if (lVar7 < lVar9) {
        lVar7 = lVar9;
      }
      if (lVar9 != -1) goto LAB_0017ceca;
      bVar3 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
    if (bVar3) goto LAB_0017cb46;
  }
  else {
    mtime = 0;
LAB_0017cb46:
    bVar3 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_138);
    if (bVar3) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_158,this_00);
      if ((local_158._M_string_length != 0) && (g_keep_rsp == false)) {
        pBVar2 = this_00->env_;
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_158._M_dataplus._M_p,
                   local_158._M_dataplus._M_p + local_158._M_string_length);
        RelPathEnv::ApplyChdir(&local_130,&pBVar2->super_RelPathEnv,&local_80);
        std::__cxx11::string::operator=((string *)&local_158,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        (*(this->disk_interface_->super_FileReader)._vptr_FileReader[8])
                  (this->disk_interface_,&local_158);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar3 = BuildLog::RecordCommand(this_01,this_00,local_ec,local_f0,mtime), bVar3)) {
        bVar3 = true;
        if ((local_110._M_string_length != 0) && (this->config_->dry_run == false)) {
          ppNVar14 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if ((long)(this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppNVar14 != 8) {
            __assert_fail("edge->outputs_.size() == 1 && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/build.cc"
                          ,0x41e,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          node = *ppNVar14;
          iVar6 = (*(this->disk_interface_->super_FileReader)._vptr_FileReader[5])
                            (this->disk_interface_,&node->env_path_,local_138);
          if (CONCAT44(extraout_var_01,iVar6) == -1) goto LAB_0017cdd2;
          bVar5 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,node,
                                      CONCAT44(extraout_var_01,iVar6),&local_a8);
          if (!bVar5) {
            local_c8[0] = local_b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_c8,"Error writing to deps log: ","");
            piVar10 = __errno_location();
            strerror(*piVar10);
            plVar11 = (long *)std::__cxx11::string::append((char *)local_c8);
            goto LAB_0017cd49;
          }
        }
      }
      else {
        local_c8[0] = local_b8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_c8,"Error writing to build log: ","");
        piVar10 = __errno_location();
        strerror(*piVar10);
        plVar11 = (long *)std::__cxx11::string::append((char *)local_c8);
LAB_0017cd49:
        psVar13 = (size_type *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_130.field_2._M_allocated_capacity = *psVar13;
          local_130.field_2._8_8_ = plVar11[3];
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar13;
          local_130._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_130._M_string_length = plVar11[1];
        *plVar11 = (long)psVar13;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_138,(string *)&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (local_c8[0] != local_b8) {
          operator_delete(local_c8[0],local_b8[0] + 1);
        }
LAB_0017cdd2:
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0017cf02;
    }
  }
LAB_0017cf00:
  bVar3 = false;
LAB_0017cf02:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar3;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int start_time, end_time;
  status_->BuildEdgeFinished(edge, result->success(), result->output,
                             &start_time, &end_time);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      // The depfile will not have current chdir and must be fixed up.
      // But first detect whether depfile was absent.
      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        // Apply chdir fixup.
        depfile = edge->env_->ApplyChdir(depfile);
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  // The rspfile will not have current chdir and must be fixed up.
  // But first detect whether rspfile was absent.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp) {
    // Apply chdir fixup.
    rspfile = edge->env_->ApplyChdir(rspfile);
    disk_interface_->RemoveFile(rspfile);
  }

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time, end_time,
                                          output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(edge->outputs_.size() == 1 && "should have been rejected by parser");
    Node* out = edge->outputs_[0];
    TimeStamp deps_mtime = disk_interface_->Stat(out->path(), err);
    if (deps_mtime == -1)
      return false;
    if (!scan_.deps_log()->RecordDeps(out, deps_mtime, deps_nodes)) {
      *err = string("Error writing to deps log: ") + strerror(errno);
      return false;
    }
  }
  return true;
}